

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t *
Acb_FindSupportNext(sat_solver *pSat,int iFirstDiv,Vec_Int_t *vWeights,Vec_Wrd_t *vPats,int *pnPats)

{
  int w;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  long lVar4;
  word *pwVar5;
  Vec_Int_t *extraout_RDX;
  Vec_Int_t *extraout_RDX_00;
  Vec_Int_t *extraout_RDX_01;
  Vec_Int_t *vWeights_00;
  int iVar6;
  int i;
  lit *begin;
  bool bVar7;
  Vec_Int_t *vSupp;
  word Mask [256];
  
  iVar6 = vWeights->nSize;
  p = Vec_IntAlloc(100);
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    Mask[lVar4] = 0xffffffffffffffff;
  }
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  iVar1 = *pnPats;
  vWeights_00 = extraout_RDX;
  vSupp = p;
  while( true ) {
    iVar1 = Acb_FindArgMaxUnderMask(vPats,Mask,vWeights_00,iVar1);
    iVar2 = Abc_Var2Lit(iVar1 + iFirstDiv,1);
    Vec_IntPush(p,iVar2);
    pwVar5 = Vec_WrdEntryP(vPats,iVar1 << 8);
    for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
      Mask[lVar4] = Mask[lVar4] & ~pwVar5[lVar4];
    }
    begin = p->pArray;
    iVar1 = sat_solver_solve(pSat,begin,begin + p->nSize,0,0,0,0);
    if (iVar1 != 1) {
      if (iVar1 == -1) {
        Vec_IntSort(p,(int)begin);
        return p;
      }
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                    ,1000,
                    "Vec_Int_t *Acb_FindSupportNext(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int *)"
                   );
    }
    i = 0;
    vWeights_00 = extraout_RDX_00;
    iVar1 = iVar6;
    iVar2 = iFirstDiv;
    while (bVar7 = iVar1 != 0, iVar1 = iVar1 + -1, bVar7) {
      iVar3 = sat_solver_var_value(pSat,iVar2);
      vWeights_00 = extraout_RDX_01;
      if (iVar3 != 0) {
        pwVar5 = Vec_WrdEntryP(vPats,i);
        vWeights_00 = (Vec_Int_t *)(1L << ((byte)*pnPats & 0x3f));
        pwVar5[*pnPats >> 6] = pwVar5[*pnPats >> 6] | (ulong)vWeights_00;
      }
      i = i + 0x100;
      iVar2 = iVar2 + 1;
    }
    iVar2 = *pnPats;
    iVar1 = iVar2 + 1;
    *pnPats = iVar1;
    if (iVar1 == 0x4000) break;
    if (0x3ffe < iVar2) {
      __assert_fail("*pnPats < NWORDS*64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                    ,0x3f7,
                    "Vec_Int_t *Acb_FindSupportNext(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int *)"
                   );
    }
  }
  printf("Exceeded %d words.\n",0x100);
  Vec_IntFreeP(&vSupp);
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Acb_FindSupportNext( sat_solver * pSat, int iFirstDiv, Vec_Int_t * vWeights, Vec_Wrd_t * vPats, int * pnPats )
{
    int i, status, nDivs = Vec_IntSize(vWeights);
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    word * pMask, Mask[NWORDS]; Abc_TtConst( Mask, NWORDS, 1 );
    while ( 1 )
    {
        int iDivBest = Acb_FindArgMaxUnderMask( vPats, Mask, vWeights, *pnPats ); 
        Vec_IntPush( vSupp, Abc_Var2Lit(iFirstDiv+iDivBest, 1) );
        //printf( "Selecting divisor %d with weight %d\n", iDivBest, Vec_IntEntry(vWeights, iDivBest) );
//        Mask &= ~Vec_WrdEntry( vPats, iDivBest );
        pMask = Vec_WrdEntryP( vPats, NWORDS*iDivBest );
        Abc_TtAndSharp( Mask, Mask, pMask, NWORDS, 1 );

        // try one run
        status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
        if ( status == l_False )
            break;
        assert( status == l_True );
        // collect pattern
        for ( i = 0; i < nDivs; i++ )
        {
            if ( sat_solver_var_value(pSat, iFirstDiv+i) == 0 )
                continue;
            Abc_TtSetBit( Vec_WrdEntryP(vPats, NWORDS*i), *pnPats );
        }
        (*pnPats)++;
        if ( *pnPats == NWORDS*64 )
        {
            printf( "Exceeded %d words.\n", NWORDS );
            Vec_IntFreeP( &vSupp );
            return NULL;
        }
        assert( *pnPats < NWORDS*64 );
        //Acb_PrintPatterns( vPats, *pnPats, vWeights );
        //i = i;
    }
    Vec_IntSort( vSupp, 0 );
    return vSupp;
}